

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * ptls_new(ptls_context_t *ctx,char *server_name)

{
  ptls_t *__dest;
  char *pcVar1;
  char *local_158 [38];
  ptls_t *local_28;
  ptls_t *tls;
  char *server_name_local;
  ptls_context_t *ctx_local;
  
  tls = (ptls_t *)server_name;
  server_name_local = (char *)ctx;
  __dest = (ptls_t *)malloc(0x130);
  if (__dest == (ptls_t *)0x0) {
    ctx_local = (ptls_context_t *)0x0;
  }
  else {
    local_28 = __dest;
    memset(local_158,0,0x130);
    local_158[0] = server_name_local;
    memcpy(__dest,local_158,0x130);
    if (tls == (ptls_t *)0x0) {
      local_28->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    }
    else {
      local_28->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
      pcVar1 = strdup((char *)tls);
      local_28->server_name = pcVar1;
      if (pcVar1 == (char *)0x0) {
        ptls_free(local_28);
        return (ptls_t *)0x0;
      }
    }
    ctx_local = (ptls_context_t *)local_28;
  }
  return (ptls_t *)ctx_local;
}

Assistant:

ptls_t *ptls_new(ptls_context_t *ctx, const char *server_name)
{
    ptls_t *tls;

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    *tls = (ptls_t){ctx};
    if (server_name != NULL) {
        tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
        if ((tls->server_name = strdup(server_name)) == NULL)
            goto Fail;
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    }

    return tls;

Fail:
    ptls_free(tls);
    return NULL;
}